

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

void add_struct_ptr_member_fn(File *fp,void **dest,OffsetEntry *oe,char *format)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  char *local_28;
  char *format_local;
  OffsetEntry *oe_local;
  void **dest_local;
  File *fp_local;
  
  if (fp->binary == 0) {
    local_28 = format;
    if ((*format == '&') && (iVar3 = strcmp(oe->name,"NULL"), iVar3 == 0)) {
      local_28 = format + 1;
    }
    if (fp->first_member == 0) {
      myfprintf(fp->fp,", ");
    }
    myfprintf(fp->fp,local_28,oe->name);
  }
  else {
    *dest = (void *)(long)oe->offset;
    if ((fp->relocations).v == (char **)0x0) {
      pcVar2 = (fp->tables).start;
      (fp->relocations).v = (fp->relocations).e;
      uVar1 = (fp->relocations).n;
      (fp->relocations).n = uVar1 + 1;
      (fp->relocations).e[uVar1] = (char *)((long)dest - (long)pcVar2);
    }
    else {
      if ((fp->relocations).v == (fp->relocations).e) {
        if ((fp->relocations).n < 3) {
          uVar1 = (fp->relocations).n;
          (fp->relocations).n = uVar1 + 1;
          (fp->relocations).v[uVar1] = (char *)((long)dest - (long)(fp->tables).start);
          goto LAB_00139952;
        }
      }
      else if (((fp->relocations).n & 7) != 0) {
        uVar1 = (fp->relocations).n;
        (fp->relocations).n = uVar1 + 1;
        (fp->relocations).v[uVar1] = (char *)((long)dest - (long)(fp->tables).start);
        goto LAB_00139952;
      }
      vec_add_internal(&fp->relocations,(void *)((long)dest - (long)(fp->tables).start));
    }
  }
LAB_00139952:
  fp->first_member = 0;
  return;
}

Assistant:

static void add_struct_ptr_member_fn(File *fp, void **dest, OffsetEntry *oe, char *format) {
  if (fp->binary) {
    *dest = (void *)(uintptr_t)oe->offset;
    vec_add(&fp->relocations, (void *)((char *)dest - fp->tables.start));
  } else {
    if (*format == '&' && strcmp(oe->name, "NULL") == 0) format++;
    if (!fp->first_member) fprintf(fp->fp, ", ");
    fprintf(fp->fp, format, oe->name);
  }
  fp->first_member = 0;
}